

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HToyIO.cpp
# Opt level: O2

int readToy_MIP_cpp(char *filename,int *m_p,int *n_p,int *maxmin,double *offset,double **A,
                   double **b,double **c,double **lb,double **ub,int **integerColumn)

{
  size_t __size;
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  int c_n;
  int iVar4;
  FILE *__stream;
  double *pdVar5;
  int *piVar6;
  char *pcVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  undefined8 local_140;
  char buff [255];
  
  printf("readMPS: Trying to open file %s\n",filename);
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    pcVar7 = "readInput: Not opened file OK";
  }
  else {
    puts("readInput: Opened file  OK");
    fgets(buff,0xff,__stream);
    __isoc99_sscanf(buff,"%d %d %d",m_p,n_p,maxmin);
    uVar1 = *n_p;
    lVar14 = (long)(int)uVar1;
    uVar10 = *m_p;
    lVar18 = (long)(int)uVar10;
    __size = lVar14 * 8;
    pdVar5 = (double *)malloc(__size);
    *c = pdVar5;
    pdVar5 = (double *)malloc(lVar18 * lVar14 * 8);
    *A = pdVar5;
    pdVar5 = (double *)malloc(lVar18 * 8);
    *b = pdVar5;
    pdVar5 = (double *)malloc(__size);
    *lb = pdVar5;
    pdVar5 = (double *)malloc(__size);
    *ub = pdVar5;
    piVar6 = (int *)malloc(lVar14 * 4);
    *integerColumn = piVar6;
    fgets(buff,0xff,__stream);
    lVar19 = 0;
    for (lVar16 = 0; lVar16 <= lVar14; lVar16 = lVar16 + 1) {
      lVar11 = (long)(int)lVar19;
      lVar15 = (lVar19 << 0x20) + -0x100000000;
      lVar19 = lVar11 + -1;
      do {
        lVar11 = lVar11 + 1;
        bVar3 = buff[lVar19 + 1];
        lVar15 = lVar15 + 0x100000000;
        lVar19 = lVar19 + 1;
      } while (bVar3 == 0x20);
      uVar9 = 0;
      while ((bVar3 & 0xdf) != 0) {
        uVar9 = uVar9 + 1;
        pbVar2 = (byte *)(buff + lVar11);
        lVar11 = lVar11 + 1;
        bVar3 = *pbVar2;
      }
      if ((int)uVar9 < 1) {
LAB_001531e0:
        pcVar7 = "Error reading file: not enough numbers on row of objective.";
        goto LAB_001533e1;
      }
      pcVar7 = (char *)malloc((ulong)uVar9);
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        pcVar7[uVar12] = buff[uVar12 + (lVar15 >> 0x20)];
      }
      dVar21 = atof(pcVar7);
      if (lVar16 < lVar14) {
        (*c)[lVar16] = dVar21;
        lVar19 = lVar11;
        if (buff[lVar11 + -1] == '\0') goto LAB_001531e0;
      }
      else {
        *offset = dVar21;
      }
    }
    uVar12 = 0;
    if (0 < (int)uVar1) {
      uVar12 = (ulong)uVar1;
    }
    local_140 = 0;
    if (0 < (int)uVar10) {
      local_140 = (ulong)uVar10;
    }
    for (uVar20 = 0; uVar20 != local_140; uVar20 = uVar20 + 1) {
      fgets(buff,0xff,__stream);
      for (lVar19 = 0; buff[lVar19] == ' '; lVar19 = lVar19 + 1) {
      }
      if (buff[lVar19] == '\0') {
        printf("Error reading file: not enough numbers on row %d of A.\n",uVar20 & 0xffffffff);
      }
      for (uVar17 = 0; iVar4 = (int)lVar19, uVar17 != uVar12; uVar17 = uVar17 + 1) {
        lVar19 = (long)iVar4;
        lVar16 = (lVar19 << 0x20) + -0x100000000;
        lVar14 = lVar19 + -1;
        do {
          lVar19 = lVar19 + 1;
          bVar3 = buff[lVar14 + 1];
          lVar16 = lVar16 + 0x100000000;
          lVar14 = lVar14 + 1;
        } while (bVar3 == 0x20);
        uVar10 = 0;
        while ((bVar3 & 0xdf) != 0) {
          uVar10 = uVar10 + 1;
          pbVar2 = (byte *)(buff + lVar19);
          lVar19 = lVar19 + 1;
          bVar3 = *pbVar2;
        }
        if ((int)uVar10 < 1) {
          pcVar7 = "Error reading file: not enough numbers on row for RHS.";
          goto LAB_001533e1;
        }
        pcVar7 = (char *)malloc((ulong)uVar10);
        for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
          pcVar7[uVar13] = buff[uVar13 + (lVar16 >> 0x20)];
        }
        dVar21 = atof(pcVar7);
        (*A)[uVar17 * lVar18 + uVar20] = dVar21;
        if (buff[lVar19 + -1] == '\0') goto LAB_001533d1;
      }
      lVar14 = (lVar19 << 0x20) + -0x100000000;
      lVar19 = (long)iVar4 + -1;
      pbVar2 = (byte *)(buff + (long)iVar4 + 1);
      do {
        pbVar8 = pbVar2;
        bVar3 = buff[lVar19 + 1];
        lVar14 = lVar14 + 0x100000000;
        lVar19 = lVar19 + 1;
        pbVar2 = pbVar8 + 1;
      } while (bVar3 == 0x20);
      uVar10 = 0;
      while ((bVar3 & 0xdf) != 0) {
        uVar10 = uVar10 + 1;
        bVar3 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      }
      if ((int)uVar10 < 1) {
LAB_001533d1:
        pcVar7 = "Error reading file: not enough numbers on constraint row.";
        goto LAB_001533e1;
      }
      pcVar7 = (char *)malloc((ulong)uVar10);
      for (uVar17 = 0; uVar10 != uVar17; uVar17 = uVar17 + 1) {
        pcVar7[uVar17] = buff[uVar17 + (lVar14 >> 0x20)];
      }
      dVar21 = atof(pcVar7);
      (*b)[uVar20] = dVar21;
    }
    for (uVar20 = 0; uVar12 != uVar20; uVar20 = uVar20 + 1) {
      (*lb)[uVar20] = 0.0;
      (*ub)[uVar20] = 1e+200;
      (*integerColumn)[uVar20] = 0;
    }
    pcVar7 = fgets(buff,0xff,__stream);
    if (pcVar7 == (char *)0x0) {
LAB_001536ed:
      fclose(__stream);
      return 0;
    }
    uVar20 = 0;
    lVar19 = 0;
    do {
      if (uVar20 == uVar12) {
        pcVar7 = fgets(buff,0xff,__stream);
        if (pcVar7 == (char *)0x0) goto LAB_001536ed;
        uVar20 = 0;
        lVar19 = 0;
        goto LAB_00153547;
      }
      lVar16 = (lVar19 << 0x20) + -0x100000000;
      lVar14 = (long)(int)lVar19 + -1;
      lVar19 = (long)(int)lVar19;
      do {
        lVar19 = lVar19 + 1;
        bVar3 = buff[lVar14 + 1];
        lVar16 = lVar16 + 0x100000000;
        lVar14 = lVar14 + 1;
      } while (bVar3 == 0x20);
      uVar10 = 0;
      while ((bVar3 & 0xdf) != 0) {
        uVar10 = uVar10 + 1;
        pbVar2 = (byte *)(buff + lVar19);
        lVar19 = lVar19 + 1;
        bVar3 = *pbVar2;
      }
      if ((int)uVar10 < 1) {
        pcVar7 = "Comment reading file: no numbers on LB row.";
        goto LAB_0015370b;
      }
      pcVar7 = (char *)malloc((ulong)uVar10);
      for (uVar17 = 0; uVar10 != uVar17; uVar17 = uVar17 + 1) {
        pcVar7[uVar17] = buff[uVar17 + (lVar16 >> 0x20)];
      }
      dVar21 = atof(pcVar7);
      (*lb)[uVar20] = dVar21;
      uVar20 = uVar20 + 1;
    } while (((int)uVar1 <= (int)uVar20) || (buff[lVar19 + -1] != '\0'));
    pcVar7 = "Error reading file: not enough numbers on LB row.";
  }
LAB_001533e1:
  puts(pcVar7);
  return 1;
  while( true ) {
    lVar16 = (lVar19 << 0x20) + -0x100000000;
    lVar14 = (long)(int)lVar19 + -1;
    lVar19 = (long)(int)lVar19;
    do {
      lVar19 = lVar19 + 1;
      bVar3 = buff[lVar14 + 1];
      lVar16 = lVar16 + 0x100000000;
      lVar14 = lVar14 + 1;
    } while (bVar3 == 0x20);
    uVar10 = 0;
    while ((bVar3 & 0xdf) != 0) {
      uVar10 = uVar10 + 1;
      pbVar2 = (byte *)(buff + lVar19);
      lVar19 = lVar19 + 1;
      bVar3 = *pbVar2;
    }
    if ((int)uVar10 < 1) {
      pcVar7 = "Comment reading file: no numbers on UB row.";
      goto LAB_0015370b;
    }
    pcVar7 = (char *)malloc((ulong)uVar10);
    for (uVar17 = 0; uVar10 != uVar17; uVar17 = uVar17 + 1) {
      pcVar7[uVar17] = buff[uVar17 + (lVar16 >> 0x20)];
    }
    dVar21 = atof(pcVar7);
    (*ub)[uVar20] = dVar21;
    uVar20 = uVar20 + 1;
    if (((int)uVar20 < (int)uVar1) && (buff[lVar19 + -1] == '\0')) break;
LAB_00153547:
    if (uVar20 == uVar12) {
      pcVar7 = fgets(buff,0xff,__stream);
      if (pcVar7 == (char *)0x0) goto LAB_001536ed;
      uVar20 = 0;
      lVar19 = 0;
      goto LAB_00153638;
    }
  }
  pcVar7 = "Error reading file: not enough numbers on UB row.";
  goto LAB_001533e1;
LAB_00153638:
  do {
    if (uVar20 == uVar12) goto LAB_001536ed;
    lVar16 = (lVar19 << 0x20) + -0x100000000;
    lVar14 = (long)(int)lVar19 + -1;
    lVar19 = (long)(int)lVar19;
    do {
      lVar19 = lVar19 + 1;
      bVar3 = buff[lVar14 + 1];
      lVar16 = lVar16 + 0x100000000;
      lVar14 = lVar14 + 1;
    } while (bVar3 == 0x20);
    uVar10 = 0;
    while ((bVar3 & 0xdf) != 0) {
      uVar10 = uVar10 + 1;
      pbVar2 = (byte *)(buff + lVar19);
      lVar19 = lVar19 + 1;
      bVar3 = *pbVar2;
    }
    if ((int)uVar10 < 1) {
      pcVar7 = "Comment reading file: no numbers on integerColumn row.";
LAB_0015370b:
      puts(pcVar7);
      return 0;
    }
    pcVar7 = (char *)malloc((ulong)uVar10);
    for (uVar17 = 0; uVar10 != uVar17; uVar17 = uVar17 + 1) {
      pcVar7[uVar17] = buff[uVar17 + (lVar16 >> 0x20)];
    }
    iVar4 = atoi(pcVar7);
    (*integerColumn)[uVar20] = iVar4;
    uVar20 = uVar20 + 1;
  } while (((int)uVar1 <= (int)uVar20) || (buff[lVar19 + -1] != '\0'));
  pcVar7 = "Error reading file: not enough numbers on integerColumn row.";
  goto LAB_001533e1;
}

Assistant:

int readToy_MIP_cpp(const char *filename, int* m_p, int* n_p, int* maxmin, double* offset,
		  double ** A,
		  double ** b, double ** c, double ** lb, double ** ub,
		  int** integerColumn) {
  const int buff_ln=255;
  char buff[buff_ln];
  char *fgets_rt;
  int n, m;
  int start, end;
  int rp_rd = 0;
  double rl_v;
  int i_v;
  char *term;
  int i, j, k;
  
#ifdef JAJH_dev
    printf("readMPS: Trying to open file %s\n", filename);
#endif
    FILE *file_p = fopen(filename, "r");
    if (file_p == 0) {
#ifdef JAJH_dev
      printf("readInput: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("readInput: Opened file  OK\n");
#endif
    fgets_rt = fgets(buff, buff_ln, file_p);
    
    sscanf(buff, "%d %d %d", m_p, n_p, maxmin);
    if (rp_rd > 0) printf("Read %d %d %d for m_p, n_p, maxmin\n", *(m_p), *(n_p), *(maxmin));
    n = *(n_p);
    m = *(m_p);
    
    //Allocate arrays
    *c = (double *) malloc(sizeof(double)*n);
    *A = (double *) malloc(sizeof(double)*(m*n));
    *b = (double *) malloc(sizeof(double)*m);
    *lb = (double *) malloc(sizeof(double)*n);
    *ub = (double *) malloc(sizeof(double)*n);
    *integerColumn = (int *) malloc(sizeof(int)*n);

    fgets_rt = fgets(buff, buff_ln, file_p);
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    //Read cost and offset
    j = 0;
    start = 0;
    while ( j <= n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Error reading file: not enough numbers on row of objective.\n");
	return 1;
      }
      
      rl_v = atof(term);
      if (j < n) {
	(*c)[j] = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for (*c)[%d]\n", term, rl_v, j);
	j++;
	if (buff[end] == '\0') {
	  printf("Error reading file: not enough numbers on row of objective.\n");
	  return 1;
	}	
	start = end + 1;
      }
      else {
	*offset = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for offset\n", term, rl_v);
	j++;
      }
    }
    
    //Read matrix and RHS
    i = 0;
    while (i < m) {
      fgets_rt = fgets(buff, buff_ln, file_p);
      
      start=0;
      while (buff[start]==' ' &&  buff[start] != '\0')
	start++;
      
      //JAJH: QY - This doesn't seem to do what was intended
      if (buff[start] == '\0')
	printf("Error reading file: not enough numbers on row %d of A.\n", i);
      
      j = 0;
      while (j < n) {
	while (buff[start]==' ')
	  start++;
	
	end = start;
	while (buff[end]!=' ' && buff[end] != '\0')
	  end++;
	
	int len = end - start;
	
	if (len>0) {
	  term = (char *) malloc(sizeof(char)*len);
	  for (k=0;k<len;k++)
	    term[k] = buff[start+k];
	} else {
	  //JAJH: QY - LEN<=0 means that the end of the line has been reached
	  printf("Error reading file: not enough numbers on row for RHS.\n");
	  return 1;
	}
	
	rl_v = atof(term);
	
	//Row-wise
	//	int ind = (i * n) + j;
	//Column-wise
	int ind = (j * m) + i;
	(*A)[ind] = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for (*A)[%d]\n", term, rl_v, ind);
	j++;
	if (buff[end] == '\0') {
	  printf("Error reading file: not enough numbers on constraint row.\n");
	  return 1;
	}	
	start = end + 1;
      }
      
      //RHS
      while (buff[start]==' ')
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Error reading file: not enough numbers on constraint row.\n");
	return 1;
      }
      
      rl_v = atof(term);
      (*b)[i] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*b)[%d]\n", term, rl_v, i);
      i++;
    }
    //Set up default values of lower bounds, upper bounds and integer information
    for (int c_n = 0; c_n < n; c_n++) {
      (*lb)[c_n] = 0;
      (*ub)[c_n] = HSOL_CONST_INF;
      (*integerColumn)[c_n] = 0;
    }

    //Read lower bounds on columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("LB: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;

      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on LB row.\n");
	return 0;
      }
      
      rl_v = atof(term);
      (*lb)[j] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*lb)[%d]\n", term, rl_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on LB row.\n");
	return 1;
      }
      start = end + 1;
    }
    
    //Read upper bounds on columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("UB: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on UB row.\n");
	return 0;
      }
      
      rl_v = atof(term);
      (*ub)[j] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*ub)[%d]\n", term, rl_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on UB row.\n");
	return 1;
      }
      start = end + 1;
    }

    //Read integer information for columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("IC: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on integerColumn row.\n");
	return 0;
      }
      
      i_v = atoi(term);
      (*integerColumn)[j] = i_v;
      if (rp_rd > 0) printf("Read %s giving %d for (*integerColumn)[%d]\n", term, i_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on integerColumn row.\n");
	return 1;
      }
      start = end + 1;
    }
    fclose(file_p);
    return 0;
}